

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_util.c
# Opt level: O3

int dec_dt_allow(int cu_w,int cu_h,int pred_mode,int max_size)

{
  int iVar1;
  
  iVar1 = 0;
  if (cu_h <= max_size && cu_w <= max_size) {
    iVar1 = (uint)(cu_w < cu_h * 4 && 0xf < cu_h) + (uint)(cu_h < cu_w * 4 && 0xf < cu_w) * 2;
  }
  return iVar1;
}

Assistant:

int dec_dt_allow(int cu_w, int cu_h, int pred_mode, int max_size)
{
    if (cu_w <= max_size && cu_h <= max_size) {
        const int min_size = 16;
        int hori_allow = cu_h >= min_size && cu_w < (cu_h << 2);
        int vert_allow = cu_w >= min_size && cu_h < (cu_w << 2);
        return hori_allow + (vert_allow << 1);
    } else {
        return 0;
    }
}